

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *this,
                 vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *list)

{
  pointer pDVar1;
  pointer data;
  DecodePsbtOutput object;
  DecodePsbtOutput DStack_1c8;
  
  pDVar1 = (list->
           super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>).
              _M_impl.super__Vector_impl_data._M_start; data != pDVar1; data = data + 1) {
    cfd::api::json::DecodePsbtOutput::DecodePsbtOutput(&DStack_1c8);
    cfd::api::json::DecodePsbtOutput::ConvertFromStruct(&DStack_1c8,data);
    ::std::
    vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>::
    push_back(&(this->super_JsonVector<cfd::api::json::DecodePsbtOutput>).
               super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
              ,&DStack_1c8);
    cfd::api::json::DecodePsbtOutput::~DecodePsbtOutput(&DStack_1c8);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }